

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

Float __thiscall pbrt::Disk::PDF(Disk *this,ShapeSampleContext *ctx,Vector3f wi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Float FVar8;
  float fVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Point3f PVar16;
  Ray ray;
  Tuple3<pbrt::Vector3,_float> local_158;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_148;
  char local_48;
  Ray local_40;
  
  local_158.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._8_56_ = wi._8_56_;
  auVar10._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_158._0_8_ = vmovlps_avx(auVar10._0_16_);
  PVar16 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)&local_158);
  local_40.o.super_Tuple3<pbrt::Point3,_float>.z = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar10._8_56_;
  local_40.time = ctx->time;
  local_40.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar11._0_16_);
  local_40.d.super_Tuple3<pbrt::Vector3,_float>.x = local_158.x;
  local_40.d.super_Tuple3<pbrt::Vector3,_float>.y = local_158.y;
  local_40.d.super_Tuple3<pbrt::Vector3,_float>.z = local_158.z;
  local_40.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  Intersect((optional<pbrt::ShapeIntersection> *)&local_148.__align,this,&local_40,INFINITY);
  FVar8 = 0.0;
  if (local_48 == '\x01') {
    uVar1 = this->radius;
    uVar2 = this->innerRadius;
    auVar3._4_4_ = local_148._8_4_;
    auVar3._0_4_ = local_148._4_4_;
    auVar3._8_4_ = local_148._12_4_;
    auVar3._12_4_ = local_148._16_4_;
    auVar14 = vinsertps_avx(auVar3,ZEXT416((uint)local_148._20_4_),0x10);
    auVar12._0_4_ = (float)uVar1 * (float)uVar1;
    auVar12._4_4_ = (float)uVar2 * (float)uVar2;
    auVar12._8_8_ = 0;
    auVar3 = vhsubps_avx(auVar12,auVar12);
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(ZEXT416((uint)local_158.z),auVar4);
    auVar6 = ZEXT416((uint)((float)local_148._48_4_ * auVar6._0_4_));
    auVar4 = vfnmadd132ss_fma(ZEXT416((uint)local_148._44_4_),auVar6,ZEXT416((uint)local_158.y));
    auVar12 = vfnmsub213ss_fma(ZEXT416((uint)local_158.z),ZEXT416((uint)local_148._48_4_),auVar6);
    auVar6._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.low;
    auVar6._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
    auVar6._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low;
    auVar6._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar5._4_4_ = local_148._4_4_;
    auVar5._0_4_ = local_148._0_4_;
    auVar5._8_4_ = local_148._8_4_;
    auVar5._12_4_ = local_148._12_4_;
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low),
                           0x10);
    auVar12 = vfnmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ + auVar12._0_4_)),
                               ZEXT416((uint)local_148._40_4_),ZEXT416((uint)local_158.x));
    auVar4 = vinsertps_avx(*(undefined1 (*) [16])
                            &(ctx->pi).super_Point3<pbrt::Interval>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                           ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10);
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(auVar12,auVar7);
    fVar9 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
            + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              high) * 0.5 - ((float)local_148._8_4_ + (float)local_148._12_4_) * 0.5;
    auVar12 = vinsertps_avx(auVar5,ZEXT416((uint)local_148._16_4_),0x10);
    auVar13._0_4_ = (auVar6._0_4_ + auVar4._0_4_) * 0.5;
    auVar13._4_4_ = (auVar6._4_4_ + auVar4._4_4_) * 0.5;
    auVar13._8_4_ = (auVar6._8_4_ + auVar4._8_4_) * 0.5;
    auVar13._12_4_ = (auVar6._12_4_ + auVar4._12_4_) * 0.5;
    auVar15._0_4_ = (auVar12._0_4_ + auVar14._0_4_) * 0.5;
    auVar15._4_4_ = (auVar12._4_4_ + auVar14._4_4_) * 0.5;
    auVar15._8_4_ = (auVar12._8_4_ + auVar14._8_4_) * 0.5;
    auVar15._12_4_ = (auVar12._12_4_ + auVar14._12_4_) * 0.5;
    auVar6 = vsubps_avx(auVar13,auVar15);
    auVar14._0_4_ = auVar6._0_4_ * auVar6._0_4_;
    auVar14._4_4_ = auVar6._4_4_ * auVar6._4_4_;
    auVar14._8_4_ = auVar6._8_4_ * auVar6._8_4_;
    auVar14._12_4_ = auVar6._12_4_ * auVar6._12_4_;
    auVar6 = vmovshdup_avx(auVar14);
    fVar9 = (1.0 / (this->phiMax * 0.5 * auVar3._0_4_)) /
            (auVar7._0_4_ / (auVar14._0_4_ + fVar9 * fVar9 + auVar6._0_4_));
    FVar8 = (Float)((uint)(ABS(fVar9) != INFINITY) * (int)fVar9);
  }
  return FVar8;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
        // Intersect sample ray with shape geometry
        Ray ray = ctx.SpawnRay(wi);
        pstd::optional<ShapeIntersection> isect = Intersect(ray);
        if (!isect)
            return 0;

        // Compute PDF in solid angle measure from shape intersection point
        Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                    DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;

        return pdf;
    }